

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O3

double __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_expr(ExpressionEvaluator *this)

{
  char *__end;
  double dVar1;
  double dVar2;
  string local_70;
  string local_50;
  
  dVar1 = _term(this);
  while( true ) {
    while( true ) {
      if (this->_token != 0x2d) break;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"- expected!","");
      _match(this,'-',&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      dVar2 = _term(this);
      dVar1 = dVar1 - dVar2;
    }
    if (this->_token != 0x2b) break;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"+ expected!","");
    _match(this,'+',&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    dVar2 = _term(this);
    dVar1 = dVar1 + dVar2;
  }
  return dVar1;
}

Assistant:

double ExpressionEvaluator::_expr()
{
	/* expr -> term  { '+' term | '-' term } */

	auto result = _term();
	while ((_token == '+') || (_token == '-'))
	{
		if (_token == '+')
		{
			_match('+', "+ expected!");
			result += _term();
		}
		else
		{
			_match('-', "- expected!");
			result -= _term();
		}
	}
	return result;
}